

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transwarp.h
# Opt level: O1

shared_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
__thiscall
transwarp::detail::make_future_with_value<std::__cxx11::string,std::__cxx11::string>
          (detail *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar2;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> promise;
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_30
  ;
  
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  promise(&local_30);
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  set_value(&local_30,value);
  std::
  __basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  __basic_future(&local_40,&local_30._M_future);
  _Var1._M_pi = local_40._M_state.
                super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  *(element_type **)this =
       local_40._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(undefined8 *)(this + 8) = 0;
  local_40._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  std::promise<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~promise(&local_30);
  sVar2.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.
  super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_state.super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (shared_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )sVar2.
           super___basic_future<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_future<ResultType> make_future_with_value(Value&& value) {
    std::promise<ResultType> promise;
    promise.set_value(std::forward<Value>(value));
    return promise.get_future();
}